

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O3

int uv__getaddrinfo_translate_error(int sys_err)

{
  int *piVar1;
  
  switch(sys_err) {
  case 0:
    break;
  case -0xc:
    sys_err = -0xbc1;
    break;
  case -0xb:
    piVar1 = __errno_location();
    sys_err = -*piVar1;
    break;
  case -10:
    sys_err = -0xbbe;
    break;
  case -9:
    sys_err = -3000;
    break;
  case -8:
    sys_err = -0xbc2;
    break;
  case -7:
    sys_err = -0xbc3;
    break;
  case -6:
    sys_err = -0xbbd;
    break;
  case -5:
    sys_err = -0xbbf;
    break;
  case -4:
    sys_err = -0xbbc;
    break;
  case -3:
    sys_err = -0xbb9;
    break;
  case -2:
    sys_err = -0xbc0;
    break;
  case -1:
    sys_err = -0xbba;
    break;
  default:
    if (sys_err != -0x65) {
      __assert_fail("!\"unknown EAI_* error code\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/getaddrinfo.c"
                    ,0x5b,"int uv__getaddrinfo_translate_error(int)");
    }
    sys_err = -0xbbb;
  }
  return sys_err;
}

Assistant:

int uv__getaddrinfo_translate_error(int sys_err) {
  switch (sys_err) {
  case 0: return 0;
#if defined(EAI_ADDRFAMILY)
  case EAI_ADDRFAMILY: return UV_EAI_ADDRFAMILY;
#endif
#if defined(EAI_AGAIN)
  case EAI_AGAIN: return UV_EAI_AGAIN;
#endif
#if defined(EAI_BADFLAGS)
  case EAI_BADFLAGS: return UV_EAI_BADFLAGS;
#endif
#if defined(EAI_BADHINTS)
  case EAI_BADHINTS: return UV_EAI_BADHINTS;
#endif
#if defined(EAI_CANCELED)
  case EAI_CANCELED: return UV_EAI_CANCELED;
#endif
#if defined(EAI_FAIL)
  case EAI_FAIL: return UV_EAI_FAIL;
#endif
#if defined(EAI_FAMILY)
  case EAI_FAMILY: return UV_EAI_FAMILY;
#endif
#if defined(EAI_MEMORY)
  case EAI_MEMORY: return UV_EAI_MEMORY;
#endif
#if defined(EAI_NODATA)
  case EAI_NODATA: return UV_EAI_NODATA;
#endif
#if defined(EAI_NONAME)
# if !defined(EAI_NODATA) || EAI_NODATA != EAI_NONAME
  case EAI_NONAME: return UV_EAI_NONAME;
# endif
#endif
#if defined(EAI_OVERFLOW)
  case EAI_OVERFLOW: return UV_EAI_OVERFLOW;
#endif
#if defined(EAI_PROTOCOL)
  case EAI_PROTOCOL: return UV_EAI_PROTOCOL;
#endif
#if defined(EAI_SERVICE)
  case EAI_SERVICE: return UV_EAI_SERVICE;
#endif
#if defined(EAI_SOCKTYPE)
  case EAI_SOCKTYPE: return UV_EAI_SOCKTYPE;
#endif
#if defined(EAI_SYSTEM)
  case EAI_SYSTEM: return UV__ERR(errno);
#endif
  }
  assert(!"unknown EAI_* error code");
  abort();
#ifndef __SUNPRO_C
  return 0;  /* Pacify compiler. */
#endif
}